

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O3

void __thiscall
adios2::format::DataManSerializer::JsonToVarMap(DataManSerializer *this,json *metaJ,VecPtr *pack)

{
  value_t vVar1;
  uint uVar2;
  json_value jVar3;
  pointer puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  int iVar7;
  key_type *pkVar8;
  uint *puVar9;
  ulonglong uVar10;
  reference pvVar11;
  reference pbVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  const_reference pvVar15;
  long lVar16;
  pointer pbVar17;
  mapped_type *pmVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  ostream *poVar20;
  undefined8 uVar21;
  string sVar22;
  vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_> *__tmp;
  pthread_mutex_t *__mutex;
  __node_base *p_Var23;
  const_iterator result_4;
  const_iterator itJson;
  iterator stepMapIt;
  size_t step;
  const_iterator it;
  iterator rankMapIt;
  iterator __begin4;
  ScopedTimer __var2173;
  iterator result_1;
  undefined1 local_378 [8];
  iterator iStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Base_ptr local_358;
  size_t local_350;
  DataManSerializer *local_340;
  const_iterator local_338;
  reference local_318;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_310;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_2f0;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_2e8;
  ulonglong local_2e0;
  const_iterator local_2d8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2b0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_290;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_270;
  pthread_mutex_t *local_260;
  pthread_mutex_t *local_258;
  pthread_mutex_t *local_250;
  pthread_mutex_t *local_248;
  VecPtr *local_240;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_238;
  ScopedTimer local_218;
  unsigned_long local_210;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  *local_208;
  _func_int **local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_1e0;
  undefined1 local_1b8 [80];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  DataType local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  _Base_ptr p_Stack_118;
  pointer local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_108;
  _Base_ptr local_100;
  pointer pbStack_f8;
  ulonglong local_d8;
  unsigned_long local_d0;
  char *local_c8;
  int local_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 auStack_78 [16];
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr p_Stack_58;
  size_t local_50;
  element_type *peStack_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [2];
  
  local_340 = this;
  local_318 = metaJ;
  local_240 = pack;
  if (JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
      ::__var173 == '\0') goto LAB_0067513f;
  do {
    local_218.m_timer = JsonToVarMap::__var173;
    if (_perfstubs_initialized == 1) {
      ps_timer_start_();
    }
    local_260 = (pthread_mutex_t *)&this->m_DataManVarMapMutex;
    iVar7 = pthread_mutex_lock(local_260);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    this->m_CombiningSteps = 0;
    local_310.m_object = local_318;
    local_310.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_310.m_it.array_iterator._M_current = (pointer)0x0;
    local_310.m_it.primitive_iterator.m_it = -0x8000000000000000;
    vVar1 = local_318->m_type;
    if (vVar1 == null) {
      local_310.m_it.primitive_iterator.m_it = 1;
    }
    else if (vVar1 == array) {
      local_310.m_it.array_iterator._M_current =
           (((local_318->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    }
    else if (vVar1 == object) {
      local_310.m_it.object_iterator._M_node = (_Base_ptr)((local_318->m_value).binary)->m_subtype;
    }
    else {
      local_310.m_it.primitive_iterator.m_it = 0;
    }
    local_248 = (pthread_mutex_t *)&this->m_DeserializedBlocksForStepMutex;
    local_2f0 = &(this->m_DeserializedBlocksForStep)._M_h;
    local_1e0 = &local_120;
    local_1e8 = &local_88;
    local_1f8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_78;
    local_250 = (pthread_mutex_t *)&this->m_StaticDataJsonMutex;
    local_208 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 *)&this->m_StaticDataJson;
    local_200 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00874c10;
    local_1f0 = &(local_240->
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount;
    local_2e8 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->m_DataManVarMap;
    local_258 = (pthread_mutex_t *)&this->m_TimeStampsMutex;
LAB_00673d23:
    local_1b8._0_8_ = local_318;
    local_1b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1b8._16_8_ = (_Base_ptr)0x0;
    local_1b8._24_8_ = (pointer)0x8000000000000000;
    if (local_318->m_type == array) {
      local_1b8._16_8_ =
           (((local_318->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (local_318->m_type == object) {
      local_1b8._8_8_ = &(((local_318->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_1b8._24_8_ = (pointer)0x1;
    }
    bVar6 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_310,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_1b8);
    if (bVar6) {
      if (4 < this->m_Verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DataManSerializer::JsonToVarMap Total buffered steps = ",
                   0x37);
        poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,": ",2);
        p_Var23 = &(this->m_DataManVarMap)._M_h._M_before_begin;
        while (p_Var23 = p_Var23->_M_nxt, p_Var23 != (__node_base *)0x0) {
          poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      pthread_mutex_unlock(local_260);
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_218);
      return;
    }
    pkVar8 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_310);
    iVar7 = std::__cxx11::string::compare((char *)pkVar8);
    if (iVar7 == 0) {
      iVar7 = pthread_mutex_lock(local_250);
      if (iVar7 != 0) {
LAB_00675119:
        std::__throw_system_error(iVar7);
      }
      pbVar12 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_310);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_270,pbVar12);
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>(local_208,"S");
      vVar1 = pvVar11->m_type;
      pvVar11->m_type = local_270.m_type;
      jVar3 = pvVar11->m_value;
      pvVar11->m_value = local_270.m_value;
      local_270.m_type = vVar1;
      local_270.m_value = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_270);
      __mutex = local_250;
LAB_00673f6a:
      pthread_mutex_unlock(__mutex);
LAB_00674ffd:
      if ((local_310.m_object)->m_type == array) {
        local_310.m_it.array_iterator._M_current = local_310.m_it.array_iterator._M_current + 1;
      }
      else if ((local_310.m_object)->m_type == object) {
        local_310.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_310.m_it.object_iterator._M_node);
      }
      else {
        local_310.m_it.primitive_iterator.m_it = local_310.m_it.primitive_iterator.m_it + 1;
      }
      goto LAB_00673d23;
    }
    pkVar8 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_310);
    iVar7 = std::__cxx11::string::compare((char *)pkVar8);
    if (iVar7 == 0) {
      iVar7 = pthread_mutex_lock(local_258);
      if (iVar7 != 0) goto LAB_00675119;
      pbVar12 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_310);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>(local_1b8,pbVar12);
      puVar4 = (this->m_TimeStamps).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->m_TimeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
      (this->m_TimeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
      (this->m_TimeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._16_8_;
      local_1b8._0_8_ = (reference)0x0;
      local_1b8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1b8._16_8_ = (_Base_ptr)0x0;
      __mutex = local_258;
      if ((puVar4 != (pointer)0x0) &&
         (operator_delete(puVar4), __mutex = local_258, (reference)local_1b8._0_8_ != (reference)0x0
         )) {
        operator_delete((void *)local_1b8._0_8_);
        __mutex = local_258;
      }
      goto LAB_00673f6a;
    }
    this->m_CombiningSteps = this->m_CombiningSteps + 1;
    pkVar8 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_310);
    pbVar12 = (reference)(pkVar8->_M_dataplus)._M_p;
    puVar9 = (uint *)__errno_location();
    uVar2 = *puVar9;
    this = (DataManSerializer *)(ulong)uVar2;
    *puVar9 = 0;
    uVar10 = strtoull((char *)pbVar12,(char **)local_1b8,10);
    if ((reference)local_1b8._0_8_ != pbVar12) {
      if (*puVar9 == 0) {
        *puVar9 = uVar2;
      }
      else if (*puVar9 == 0x22) goto LAB_00675133;
      local_2e0 = uVar10;
      iVar7 = pthread_mutex_lock(local_248);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      iVar13 = std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(local_2f0,&local_2e0);
      this = local_340;
      if (iVar13.super__Node_iterator_base<std::pair<const_unsigned_long,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        pmVar14 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_2f0,&local_2e0);
        *pmVar14 = 1;
      }
      else {
        pmVar14 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_2f0,&local_2e0);
        *pmVar14 = *pmVar14 + 1;
      }
      pthread_mutex_unlock(local_248);
      local_2b0.m_object =
           nlohmann::detail::
           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&local_310);
      local_2b0.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_2b0.m_it.array_iterator._M_current = (pointer)0x0;
      local_2b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      vVar1 = (local_2b0.m_object)->m_type;
      if (vVar1 == null) {
        local_2b0.m_it.primitive_iterator.m_it = 1;
      }
      else if (vVar1 == array) {
        local_2b0.m_it.array_iterator._M_current =
             ((((local_2b0.m_object)->m_value).array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      }
      else if (vVar1 == object) {
        local_2b0.m_it.object_iterator._M_node =
             (_Base_ptr)(((local_2b0.m_object)->m_value).binary)->m_subtype;
      }
      else {
        local_2b0.m_it.primitive_iterator.m_it = 0;
      }
      while( true ) {
        local_1b8._0_8_ =
             nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_310);
        local_1b8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1b8._16_8_ = (_Base_ptr)0x0;
        local_1b8._24_8_ = (pointer)0x8000000000000000;
        if (((reference)local_1b8._0_8_)->m_type == array) {
          local_1b8._16_8_ =
               (((((reference)local_1b8._0_8_)->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else if (((reference)local_1b8._0_8_)->m_type == object) {
          local_1b8._8_8_ =
               &(((((reference)local_1b8._0_8_)->m_value).object)->_M_t)._M_impl.
                super__Rb_tree_header;
        }
        else {
          local_1b8._24_8_ = (pointer)0x1;
        }
        bVar6 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_2b0,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_1b8);
        if (bVar6) break;
        local_290.m_object =
             nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_2b0);
        local_290.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
        local_290.m_it.array_iterator._M_current = (pointer)0x0;
        local_290.m_it.primitive_iterator.m_it = -0x8000000000000000;
        vVar1 = (local_290.m_object)->m_type;
        local_238.m_object = local_290.m_object;
        if (vVar1 == null) {
          local_290.m_it.primitive_iterator.m_it = 1;
LAB_00674178:
          local_238.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_238.m_it.array_iterator._M_current = (pointer)0x0;
          local_238.m_it.primitive_iterator.m_it = 1;
        }
        else if (vVar1 == array) {
          local_290.m_it.array_iterator._M_current =
               ((((local_290.m_object)->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_238.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_238.m_it.primitive_iterator.m_it = -0x8000000000000000;
          local_238.m_it.array_iterator._M_current =
               ((((local_290.m_object)->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          if (vVar1 != object) {
            local_290.m_it.primitive_iterator.m_it = 0;
            goto LAB_00674178;
          }
          local_290.m_it.object_iterator._M_node =
               (_Base_ptr)(((local_290.m_object)->m_value).binary)->m_subtype;
          local_238.m_it.array_iterator._M_current = (pointer)0x0;
          local_238.m_it.primitive_iterator.m_it = -0x8000000000000000;
          local_238.m_it.object_iterator._M_node =
               &((((local_290.m_object)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                _M_header;
        }
        while (bVar6 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::
                       operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                 (&local_290,&local_238), !bVar6) {
          this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_290);
          local_1b8._56_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1b8._64_8_ = (_Base_ptr)0x0;
          local_1b8._40_8_ = (_Base_ptr)0x0;
          local_1b8._48_8_ = (pointer)0x0;
          local_1b8._24_8_ = (pointer)0x0;
          local_1b8._32_8_ = (pointer)0x0;
          local_1b8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1b8._16_8_ = (_Base_ptr)0x0;
          local_1b8._72_8_ = (pointer)0x0;
          local_168._M_p = (pointer)&local_158;
          local_160 = 0;
          local_158._M_local_buf[0] = '\0';
          local_148._M_p = (pointer)&local_138;
          local_140 = 0;
          local_138._M_local_buf[0] = '\0';
          local_1e0[8] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_1e0[6] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_1e0[7] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_1e0[4] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_1e0[5] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_1e0[2] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_1e0[3] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          *local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          local_1e0[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          local_b8._M_p = (pointer)&local_a8;
          local_b0 = 0;
          local_a8._M_local_buf[0] = '\0';
          local_98._M_p = (pointer)local_1e8;
          local_90 = 0;
          local_88._M_local_buf[0] = '\0';
          auStack_78._8_4_ = _S_red;
          local_68 = (_Base_ptr)0x0;
          local_60 = (_Base_ptr)(auStack_78 + 8);
          local_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_50 = 0;
          peStack_48 = (element_type *)0x0;
          p_Stack_58 = local_60;
          pkVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&local_310);
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pkVar8->_M_dataplus)._M_p;
          uVar2 = *puVar9;
          *puVar9 = 0;
          uVar10 = strtoull(paVar5->_M_local_buf,(char **)local_378,10);
          if (local_378 == (undefined1  [8])paVar5) {
            uVar21 = std::__throw_invalid_argument("stoull");
LAB_00675197:
            __cxa_guard_abort(&JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
                               ::__var173);
            _Unwind_Resume(uVar21);
          }
          if (*puVar9 == 0) {
            *puVar9 = uVar2;
          }
          else if (*puVar9 == 0x22) {
            uVar21 = std::__throw_out_of_range("stoull");
            goto LAB_00675197;
          }
          local_d8 = uVar10;
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_378,pvVar15);
          std::__cxx11::string::operator=((string *)&local_168,(string *)local_378);
          if (local_378 != (undefined1  [8])&local_368) {
            operator_delete((void *)local_378);
          }
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"O");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                    (local_378,pvVar15);
          uVar21 = local_1b8._56_8_;
          local_1b8._56_8_ = local_378;
          local_1b8._64_8_ = iStack_370._M_node;
          local_1b8._72_8_ = local_368._M_allocated_capacity;
          local_378 = (undefined1  [8])0x0;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar21 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) && (operator_delete((void *)uVar21), local_378 != (undefined1  [8])0x0)) {
            operator_delete((void *)local_378);
          }
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"C");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                    (local_378,pvVar15);
          uVar21 = local_1b8._32_8_;
          local_1b8._32_8_ = local_378;
          local_1b8._40_8_ = iStack_370._M_node;
          local_1b8._48_8_ = local_368._M_allocated_capacity;
          local_378 = (undefined1  [8])0x0;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          if (((pointer)uVar21 != (pointer)0x0) &&
             (operator_delete((void *)uVar21), local_378 != (undefined1  [8])0x0)) {
            operator_delete((void *)local_378);
          }
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"I");
          local_210 = 0;
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                    (pvVar15,&local_210);
          local_d0 = local_210;
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"Y");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_378,pvVar15);
          local_128 = helper::GetDataTypeFromString((string *)local_378);
          if (local_378 != (undefined1  [8])&local_368) {
            operator_delete((void *)local_378);
          }
          pkVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&local_2b0);
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pkVar8->_M_dataplus)._M_p;
          uVar2 = *puVar9;
          *puVar9 = 0;
          lVar16 = strtol(paVar5->_M_local_buf,(char **)local_378,10);
          this = local_340;
          if (local_378 == (undefined1  [8])paVar5) {
            uVar21 = std::__throw_invalid_argument("stoi");
            goto LAB_00675197;
          }
          if (((int)lVar16 != lVar16) || (*puVar9 == 0x22)) {
            uVar21 = std::__throw_out_of_range("stoi");
            goto LAB_00675197;
          }
          if (*puVar9 == 0) {
            *puVar9 = uVar2;
          }
          local_c0 = (int)lVar16;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    (&local_338,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x7422ca);
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_378,pbVar17);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)local_378);
            if (local_378 != (undefined1  [8])&local_368) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x7423a3);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_378,pbVar17);
            std::__cxx11::string::operator=((string *)&local_148,(string *)local_378);
            if (local_378 != (undefined1  [8])&local_368) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x7404f4);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          sVar22 = (string)0x1;
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffffffffff00);
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (pbVar17,(boolean_t *)local_378);
            sVar22 = local_378[0];
          }
          local_1b8[0] = sVar22;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x741f60);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          sVar22 = (string)0x1;
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffffffffff00);
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (pbVar17,(boolean_t *)local_378);
            sVar22 = local_378[0];
          }
          local_1b8[1] = sVar22;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x75b7ab);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                      (local_378,pbVar17);
            uVar21 = local_1b8._8_8_;
            local_1b8._8_8_ = local_378;
            local_1b8._16_8_ = iStack_370._M_node;
            local_1b8._24_8_ = local_368._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            iStack_370._M_node = (_Base_ptr)0x0;
            local_368._M_allocated_capacity = 0;
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar21 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) && (operator_delete((void *)uVar21), local_378 != (undefined1  [8])0x0)) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x744fc3);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<char,_std::allocator<char>_>,_0>(local_378,pbVar17);
            paVar5 = paStack_108;
            paStack_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_378;
            local_100 = iStack_370._M_node;
            pbStack_f8 = (pointer)local_368._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            iStack_370._M_node = (_Base_ptr)0x0;
            local_368._M_allocated_capacity = 0;
            if ((paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0) && (operator_delete(paVar5), local_378 != (undefined1  [8])0x0))
            {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])0x75bae6);
          local_338.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_338.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_338.m_object = (pointer)local_378;
          local_338.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_338,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_338);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<char,_std::allocator<char>_>,_0>(local_378,pbVar17);
            paVar5 = local_120;
            local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378;
            p_Stack_118 = iStack_370._M_node;
            local_110 = (pointer)local_368._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            iStack_370._M_node = (_Base_ptr)0x0;
            local_368._M_allocated_capacity = 0;
            if ((paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0) && (operator_delete(paVar5), local_378 != (undefined1  [8])0x0))
            {
              operator_delete((void *)local_378);
            }
          }
          pvVar15 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_01->_M_local_buf,"P");
          local_378 = (undefined1  [8])0x0;
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                    (pvVar15,(unsigned_long *)local_378);
          local_c8 = (char *)local_378;
          peStack_48 = (local_240->
                       super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_40,local_1f0);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[2]>
                    (&local_2d8,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [2])"Z");
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = 1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_2d8,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_2d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_378,pbVar17);
            std::__cxx11::string::operator=((string *)&local_98,(string *)local_378);
            if (local_378 != (undefined1  [8])&local_368) {
              operator_delete((void *)local_378);
            }
          }
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<char_const(&)[3]>
                    ((const_iterator *)local_378,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01->_M_local_buf,(char (*) [3])"ZP");
          local_2d8.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_368._M_allocated_capacity;
          local_2d8.m_it.primitive_iterator.m_it = local_368._8_8_;
          local_2d8.m_object = (pointer)local_378;
          local_2d8.m_it.object_iterator._M_node = iStack_370._M_node;
          iStack_370._M_node = (_Base_ptr)0x0;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = (iterator *)0x8000000000000000;
          if (this_01->_M_local_buf[0] == '\x02') {
            local_368._M_allocated_capacity =
                 (size_type)
                 (((json_value *)(this_01->_M_local_buf + 8))->array->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else if (this_01->_M_local_buf[0] == '\x01') {
            iStack_370._M_node =
                 &(((json_value *)(this_01->_M_local_buf + 8))->object->_M_t)._M_impl.
                  super__Rb_tree_header._M_header;
          }
          else {
            local_368._8_8_ = (iterator *)0x1;
          }
          local_378 = (undefined1  [8])this_01;
          bVar6 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_2d8,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
          if (!bVar6) {
            pbVar17 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator->(&local_2d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                      (local_378,pbVar17);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::clear(local_1f8);
            if ((pointer)local_368._M_allocated_capacity != (pointer)0x0) {
              auStack_78._8_4_ = (_Rb_tree_color)iStack_370._M_node;
              local_68 = (_Base_ptr)local_368._M_allocated_capacity;
              local_60 = (_Base_ptr)local_368._8_8_;
              p_Stack_58 = local_358;
              ((json_value *)(local_368._M_allocated_capacity + 8))->object =
                   (object_t *)(auStack_78 + 8);
              local_50 = local_350;
              local_368._M_allocated_capacity = 0;
              local_368._8_8_ = &iStack_370;
              local_350 = 0;
              local_358 = (_Base_ptr)local_368._8_8_;
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_378);
          }
          pmVar18 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_2e8,&local_d8);
          if ((pmVar18->
              super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr == (element_type *)0x0) {
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
            p_Var19->_M_use_count = 1;
            p_Var19->_M_weak_count = 1;
            p_Var19->_vptr__Sp_counted_base = local_200;
            p_Var19[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var19[1]._M_use_count = 0;
            p_Var19[1]._M_weak_count = 0;
            p_Var19[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            pmVar18 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_2e8,&local_d8);
            (pmVar18->
            super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr = (element_type *)(p_Var19 + 1);
            this_00 = (pmVar18->
                      super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            (pmVar18->
            super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi = p_Var19;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          pmVar18 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_2e8,&local_d8);
          std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>::
          emplace_back<adios2::format::DataManVar>
                    ((pmVar18->
                     super___shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,(DataManVar *)local_1b8);
          DataManVar::~DataManVar((DataManVar *)local_1b8);
          if ((local_290.m_object)->m_type == array) {
            local_290.m_it.array_iterator._M_current = local_290.m_it.array_iterator._M_current + 1;
          }
          else if ((local_290.m_object)->m_type == object) {
            local_290.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_290.m_it.object_iterator._M_node);
          }
          else {
            local_290.m_it.primitive_iterator.m_it = local_290.m_it.primitive_iterator.m_it + 1;
          }
        }
        if ((local_2b0.m_object)->m_type == array) {
          local_2b0.m_it.array_iterator._M_current = local_2b0.m_it.array_iterator._M_current + 1;
        }
        else if ((local_2b0.m_object)->m_type == object) {
          local_2b0.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_2b0.m_it.object_iterator._M_node);
        }
        else {
          local_2b0.m_it.primitive_iterator.m_it = local_2b0.m_it.primitive_iterator.m_it + 1;
        }
      }
      goto LAB_00674ffd;
    }
    std::__throw_invalid_argument("stoull");
LAB_00675133:
    std::__throw_out_of_range("stoull");
LAB_0067513f:
    iVar7 = __cxa_guard_acquire(&JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
                                 ::__var173);
    if (iVar7 != 0) {
      uVar21 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                   ,
                                   "void adios2::format::DataManSerializer::JsonToVarMap(nlohmann::json &, VecPtr)"
                                   ,0xad);
      JsonToVarMap::__var173 = (void *)ps_timer_create_(uVar21);
      __cxa_guard_release(&JsonToVarMap(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,std::shared_ptr<std::vector<char,std::allocator<char>>>)
                           ::__var173);
      this = local_340;
    }
  } while( true );
}

Assistant:

void DataManSerializer::JsonToVarMap(nlohmann::json &metaJ, VecPtr pack)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    // the mutex has to be locked here through the entire function. Otherwise
    // reader engine could get incomplete step metadata. This function only
    // deals with JSON metadata and data buffer already in allocated shared
    // pointers, so it should be cheap to lock.
    std::lock_guard<std::mutex> lDataManVarMapMutex(m_DataManVarMapMutex);

    m_CombiningSteps = 0;

    for (auto stepMapIt = metaJ.begin(); stepMapIt != metaJ.end(); ++stepMapIt)
    {
        if (stepMapIt.key() == "S")
        {
            m_StaticDataJsonMutex.lock();
            m_StaticDataJson["S"] = stepMapIt.value();
            m_StaticDataJsonMutex.unlock();
            continue;
        }
        if (stepMapIt.key() == "T")
        {
            m_TimeStampsMutex.lock();
            m_TimeStamps = stepMapIt.value().get<std::vector<uint64_t>>();
            m_TimeStampsMutex.unlock();
            continue;
        }

        ++m_CombiningSteps;
        size_t step = stoull(stepMapIt.key());
        m_DeserializedBlocksForStepMutex.lock();
        auto blocksForStepIt = m_DeserializedBlocksForStep.find(step);
        if (blocksForStepIt == m_DeserializedBlocksForStep.end())
        {
            m_DeserializedBlocksForStep[step] = 1;
        }
        else
        {
            ++m_DeserializedBlocksForStep[step];
        }
        m_DeserializedBlocksForStepMutex.unlock();

        for (auto rankMapIt = stepMapIt.value().begin(); rankMapIt != stepMapIt.value().end();
             ++rankMapIt)
        {
            for (const auto &varBlock : rankMapIt.value())
            {
                DataManVar var;
                try
                {
                    // compulsory properties
                    var.step = stoull(stepMapIt.key());
                    var.name = varBlock["N"].get<std::string>();
                    var.start = varBlock["O"].get<Dims>();
                    var.count = varBlock["C"].get<Dims>();
                    var.size = varBlock["I"].get<size_t>();
                    var.type = helper::GetDataTypeFromString(varBlock["Y"].get<std::string>());
                    var.rank = stoi(rankMapIt.key());
                }
                catch (std::exception &e)
                {
                    helper::Throw<std::runtime_error>(
                        "Toolkit::Format", "dataman::DataManSerializer", "JsonToVarMap",
                        "missing compulsory properties in JSON metadata");
                }

                // optional properties

                auto itJson = varBlock.find("A");
                if (itJson != varBlock.end())
                {
                    var.address = itJson->get<std::string>();
                }

                itJson = varBlock.find("D");
                if (itJson != varBlock.end())
                {
                    var.doid = itJson->get<std::string>();
                }

                itJson = varBlock.find("M");
                if (itJson != varBlock.end())
                {
                    var.isRowMajor = itJson->get<bool>();
                }
                else
                {
                    var.isRowMajor = true;
                }

                itJson = varBlock.find("E");
                if (itJson != varBlock.end())
                {
                    var.isLittleEndian = itJson->get<bool>();
                }
                else
                {
                    var.isLittleEndian = true;
                }

                itJson = varBlock.find("S");
                if (itJson != varBlock.end())
                {
                    var.shape = itJson->get<Dims>();
                }

                itJson = varBlock.find("+");
                if (itJson != varBlock.end())
                {
                    var.max = itJson->get<std::vector<char>>();
                }

                itJson = varBlock.find("-");
                if (itJson != varBlock.end())
                {
                    var.min = itJson->get<std::vector<char>>();
                }

                var.position = varBlock["P"].get<size_t>();
                var.buffer = pack;

                auto it = varBlock.find("Z");
                if (it != varBlock.end())
                {
                    var.compression = it->get<std::string>();
                }

                it = varBlock.find("ZP");
                if (it != varBlock.end())
                {
                    var.params = it->get<Params>();
                }

                if (m_DataManVarMap[var.step] == nullptr)
                {
                    m_DataManVarMap[var.step] = std::make_shared<std::vector<DataManVar>>();
                }
                m_DataManVarMap[var.step]->emplace_back(std::move(var));
            }
        }
    }
    if (m_Verbosity >= 5)
    {
        std::cout << "DataManSerializer::JsonToVarMap Total buffered steps = "
                  << m_DataManVarMap.size() << ": ";
        for (const auto &i : m_DataManVarMap)
        {
            std::cout << i.first << ", ";
        }
        std::cout << std::endl;
    }
}